

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O0

Dim * __thiscall
cnn::Reshape::dim_forward(Reshape *this,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  uint uVar1;
  uint uVar2;
  size_type sVar3;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *in_RDX;
  long in_RSI;
  Dim *in_RDI;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  sVar3 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::size(in_RDX);
  if (sVar3 != 1) {
    __assert_fail("xs.size() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/nodes-common.cc"
                  ,0xd6,"virtual Dim cnn::Reshape::dim_forward(const vector<Dim> &) const");
  }
  std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,0);
  uVar1 = Dim::size((Dim *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  uVar2 = Dim::size((Dim *)CONCAT44(uVar1,in_stack_ffffffffffffffd0));
  if (uVar1 == uVar2) {
    memcpy(in_RDI,(void *)(in_RSI + 0x50),0x24);
    return in_RDI;
  }
  __assert_fail("xs[0].size() == to.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/nodes-common.cc"
                ,0xd7,"virtual Dim cnn::Reshape::dim_forward(const vector<Dim> &) const");
}

Assistant:

Dim Reshape::dim_forward(const vector<Dim>& xs) const {
  assert(xs.size() == 1);
  assert(xs[0].size() == to.size());
  return to;
}